

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void computeHMS(DateTime *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  double dVar4;
  
  if (p->validHMS != '\0') {
    return;
  }
  computeJD(p);
  lVar3 = p->iJD + 43200000;
  auVar1 = SEXT816(lVar3) * SEXT816(0x636ba875fd33dc87);
  dVar4 = (double)((int)lVar3 + ((int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f)) * -86400000)
          / 1000.0;
  p->h = (int)dVar4 / 0xe10;
  iVar2 = (int)dVar4 % 0xe10;
  p->m = iVar2 / 0x3c;
  p->s = (double)(iVar2 % 0x3c) + (dVar4 - (double)(int)dVar4);
  p->rawS = '\0';
  p->validHMS = '\x01';
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int s;
  if( p->validHMS ) return;
  computeJD(p);
  s = (int)((p->iJD + 43200000) % 86400000);
  p->s = s/1000.0;
  s = (int)p->s;
  p->s -= s;
  p->h = s/3600;
  s -= p->h*3600;
  p->m = s/60;
  p->s += s - p->m*60;
  p->rawS = 0;
  p->validHMS = 1;
}